

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_latex_binary_expr_processor<viennamath::rt_expression_interface<double>>::
process_abi_cxx11_(string *__return_storage_ptr__,void *this,rt_expression_interface<double> *ptr,
                  bool use_parenthesis,
                  rt_latex_translator<viennamath::rt_expression_interface<double>_> *translator)

{
  BinaryExpr *local_88;
  long local_78;
  allocator<char> local_39;
  BinaryExpr *local_38;
  BinaryExpr *temp;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *translator_local;
  rt_expression_interface<double> *prStack_20;
  bool use_parenthesis_local;
  rt_expression_interface<double> *ptr_local;
  rt_latex_binary_expr_processor<viennamath::rt_expression_interface<double>_> *this_local;
  
  temp = (BinaryExpr *)translator;
  translator_local._7_1_ = use_parenthesis;
  prStack_20 = ptr;
  ptr_local = (rt_expression_interface<double> *)this;
  this_local = (rt_latex_binary_expr_processor<viennamath::rt_expression_interface<double>_> *)
               __return_storage_ptr__;
  if (ptr == (rt_expression_interface<double> *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = __dynamic_cast(ptr,&rt_expression_interface<double>::typeinfo,
                              &rt_binary_expr<viennamath::rt_expression_interface<double>>::typeinfo
                              ,0);
  }
  if (local_78 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    if (prStack_20 == (rt_expression_interface<double> *)0x0) {
      local_88 = (BinaryExpr *)0x0;
    }
    else {
      local_88 = (BinaryExpr *)
                 __dynamic_cast(prStack_20,&rt_expression_interface<double>::typeinfo,
                                &rt_binary_expr<viennamath::rt_expression_interface<double>>::
                                 typeinfo,0);
    }
    local_38 = local_88;
    process_impl_abi_cxx11_
              (__return_storage_ptr__,this,local_88,(bool)(translator_local._7_1_ & 1),
               (rt_latex_translator<viennamath::rt_expression_interface<double>_> *)temp);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string process(InterfaceType const * ptr, bool use_parenthesis, rt_latex_translator<InterfaceType> const & translator) const
      {
        if (dynamic_cast< const BinaryExpr * >(ptr) != NULL)
        {
          const BinaryExpr * temp = dynamic_cast< const BinaryExpr * >(ptr);
          return process_impl(*temp, use_parenthesis, translator);
        }

        return "";
      }